

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O3

int bin_mdef_phone_id_nearest(bin_mdef_t *m,int32 b,int32 l,int32 r,int32 pos)

{
  int rc;
  int32 iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = b;
  if ((-1 < (r | l)) && (iVar1 = bin_mdef_phone_id(m,b,l,r,pos), iVar1 < 0)) {
    iVar4 = 0;
    do {
      if ((pos != iVar4) && (iVar2 = bin_mdef_phone_id(m,b,l,r,iVar4), -1 < iVar2)) {
        return iVar2;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != 4);
    iVar4 = m->sil;
    iVar1 = b;
    if (-1 < iVar4) {
      iVar2 = l;
      if (m->phone[(uint)l].info.ci.filler != '\0') {
        iVar2 = iVar4;
      }
      if ((pos & 0xfffffffdU) == 1) {
        iVar2 = iVar4;
      }
      rc = r;
      if (m->phone[(uint)r].info.ci.filler != '\0') {
        rc = iVar4;
      }
      if ((pos & 0xfffffffeU) == 2) {
        rc = iVar4;
      }
      if (((iVar2 != l) || (rc != r)) && (iVar1 = bin_mdef_phone_id(m,b,iVar2,rc,pos), iVar1 < 0)) {
        iVar4 = 0;
        do {
          if ((pos != iVar4) && (iVar3 = bin_mdef_phone_id(m,b,iVar2,rc,iVar4), -1 < iVar3)) {
            return iVar3;
          }
          iVar4 = iVar4 + 1;
          iVar1 = b;
        } while (iVar4 != 4);
      }
    }
  }
  return iVar1;
}

Assistant:

int
bin_mdef_phone_id_nearest(bin_mdef_t * m, int32 b, int32 l, int32 r, int32 pos)
{
    int p, tmppos;



    /* In the future, we might back off when context is not available,
     * but for now we'll just return the CI phone. */
    if (l < 0 || r < 0)
        return b;

    p = bin_mdef_phone_id(m, b, l, r, pos);
    if (p >= 0)
        return p;

    /* Exact triphone not found; backoff to other word positions */
    for (tmppos = 0; tmppos < N_WORD_POSN; tmppos++) {
        if (tmppos != pos) {
            p = bin_mdef_phone_id(m, b, l, r, tmppos);
            if (p >= 0)
                return p;
        }
    }

    /* Nothing yet; backoff to silence phone if non-silence filler context */
    /* In addition, backoff to silence phone on left/right if in beginning/end position */
    if (m->sil >= 0) {
        int newl = l, newr = r;
        if (m->phone[(int)l].info.ci.filler
            || pos == WORD_POSN_BEGIN || pos == WORD_POSN_SINGLE)
            newl = m->sil;
        if (m->phone[(int)r].info.ci.filler
            || pos == WORD_POSN_END || pos == WORD_POSN_SINGLE)
            newr = m->sil;
        if ((newl != l) || (newr != r)) {
            p = bin_mdef_phone_id(m, b, newl, newr, pos);
            if (p >= 0)
                return p;

            for (tmppos = 0; tmppos < N_WORD_POSN; tmppos++) {
                if (tmppos != pos) {
                    p = bin_mdef_phone_id(m, b, newl, newr, tmppos);
                    if (p >= 0)
                        return p;
                }
            }
        }
    }

    /* Nothing yet; backoff to base phone */
    return b;
}